

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_zip64.c
# Opt level: O1

void verify_zip_filesize(uint64_t size,int expected)

{
  int iVar1;
  archive *_a;
  archive_entry *entry;
  size_t used;
  char buff [256];
  size_t local_140;
  undefined1 local_138 [264];
  
  _a = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_zip64.c"
                   ,L'&',(uint)(_a != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_zip(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_zip64.c"
                      ,L'\'',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",_a);
  iVar1 = archive_write_set_format_option(_a,"zip","zip64",(char *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_zip64.c"
                      ,L'*',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_set_format_option(a, \"zip\", \"zip64\", NULL)",_a);
  iVar1 = archive_write_open_memory(_a,local_138,0x100,&local_140);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_zip64.c"
                      ,L',',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, sizeof(buff), &used)",_a);
  entry = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_zip64.c"
                   ,L'.',(uint)(entry != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_set_pathname(entry,"test");
  archive_entry_set_mode(entry,0x81a4);
  archive_entry_set_size(entry,size);
  iVar1 = archive_write_header(_a,entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_zip64.c"
                      ,L'2',(long)expected,"expected",(long)iVar1,"archive_write_header(a, ae)",
                      (void *)0x0);
  iVar1 = archive_write_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_zip64.c"
                      ,L'5',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",_a);
  return;
}

Assistant:

static void
verify_zip_filesize(uint64_t size, int expected)
{
	struct archive *a;
	struct archive_entry *ae;
	char buff[256];
	size_t used;

	/* Zip format: Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_zip(a));
	/* Disable Zip64 extensions. */
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_format_option(a, "zip", "zip64", NULL));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_pathname(ae, "test");
	archive_entry_set_mode(ae, AE_IFREG | 0644);
	archive_entry_set_size(ae, size);
	assertEqualInt(expected, archive_write_header(a, ae));

	/* Don't actually write 4GB! ;-) */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));
}